

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O2

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::MergeArchives
          (ArchiverFactoryImpl *this,IDataBlob **ppSrcArchives,Uint32 NumSrcArchives,
          IDataBlob **ppDstArchive)

{
  IDataBlob *pIVar1;
  ulong uVar2;
  CreateInfo local_220;
  string msg;
  DeviceObjectArchive Archive;
  
  if (NumSrcArchives != 0) {
    if (ppSrcArchives == (IDataBlob **)0x0) {
      FormatString<char[31]>(&msg,(char (*) [31])"ppSrcArchives must not be null");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MergeArchives",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
                 ,0x12f);
      std::__cxx11::string::~string((string *)&msg);
      if (ppDstArchive != (IDataBlob **)0x0) {
        return false;
      }
    }
    else if (ppDstArchive != (IDataBlob **)0x0) {
      Archive.m_NamedResources._M_h._M_buckets = (__buckets_ptr)*ppSrcArchives;
      Archive.m_NamedResources._M_h._M_bucket_count._0_4_ = 0xffffffff;
      Archive.m_NamedResources._M_h._M_bucket_count._4_1_ = 0;
      DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)&msg,(CreateInfo *)&Archive);
      for (uVar2 = 1; uVar2 < NumSrcArchives; uVar2 = uVar2 + 1) {
        local_220.pData = ppSrcArchives[uVar2];
        local_220.ContentVersion = 0xffffffff;
        local_220.MakeCopy = false;
        DeviceObjectArchive::DeviceObjectArchive(&Archive,&local_220);
        DeviceObjectArchive::Merge((DeviceObjectArchive *)&msg,&Archive);
        DeviceObjectArchive::~DeviceObjectArchive(&Archive);
      }
      DeviceObjectArchive::Serialize((DeviceObjectArchive *)&msg,ppDstArchive);
      pIVar1 = *ppDstArchive;
      DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)&msg);
      return pIVar1 != (IDataBlob *)0x0;
    }
    FormatString<char[30]>(&msg,(char (*) [30])"ppDstArchive must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"MergeArchives",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverFactory.cpp"
               ,0x130);
    std::__cxx11::string::~string((string *)&msg);
  }
  return false;
}

Assistant:

Bool ArchiverFactoryImpl::MergeArchives(
    const IDataBlob* ppSrcArchives[],
    Uint32           NumSrcArchives,
    IDataBlob**      ppDstArchive) const
{
    if (NumSrcArchives == 0)
        return false;

    DEV_CHECK_ERR(ppSrcArchives != nullptr, "ppSrcArchives must not be null");
    DEV_CHECK_ERR(ppDstArchive != nullptr, "ppDstArchive must not be null");

    if (ppSrcArchives == nullptr || ppDstArchive == nullptr)
        return false;

    try
    {
        DeviceObjectArchive MergedArchive{DeviceObjectArchive::CreateInfo{ppSrcArchives[0]}};
        for (Uint32 i = 1; i < NumSrcArchives; ++i)
        {
            const DeviceObjectArchive Archive{DeviceObjectArchive::CreateInfo{ppSrcArchives[i]}};
            MergedArchive.Merge(Archive);
        }

        MergedArchive.Serialize(ppDstArchive);
        return *ppDstArchive != nullptr;
    }
    catch (...)
    {
        return false;
    }
}